

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_test.cpp
# Opt level: O1

void test_function<Gudhi::coxeter_triangulation::Function_affine_plane_in_Rd>
               (Function_affine_plane_in_Rd *fun)

{
  ulong uVar1;
  VectorXd res_seed;
  VectorXd seed;
  VectorXd result_1;
  Function_affine_plane_in_Rd local_f8;
  char *local_c0;
  char *local_b8;
  DenseStorage<double,__1,__1,_1,_0> local_b0;
  undefined8 *local_a0;
  char **local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&local_f8.off_,
             (DenseStorage<double,__1,__1,_1,_0> *)&fun->off_);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_b0,(DenseStorage<double,__1,__1,_1,_0> *)&fun->off_);
  Gudhi::coxeter_triangulation::Function_affine_plane_in_Rd::operator()(&local_f8,(VectorXd *)fun);
  free(local_b0.m_data);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/function_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x32);
  local_f8.normal_matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
  .m_cols._0_1_ =
       local_f8.off_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       == fun->d_;
  local_f8.d_ = 0;
  local_f8.k_ = 0;
  local_c0 = "seed.size() == (long int)fun.amb_d()";
  local_b8 = "";
  local_b0.m_rows._0_1_ = 0;
  local_b0.m_data = (double *)&PTR__lazy_ostream_00149d00;
  local_a0 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/function_test.cpp"
  ;
  local_58 = "";
  local_98 = &local_c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_f8.k_);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/function_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x33);
  local_f8.normal_matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
  .m_cols._0_1_ =
       local_f8.normal_matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       m_storage.m_rows == fun->k_;
  local_f8.d_ = 0;
  local_f8.k_ = 0;
  local_c0 = "res_seed.size() == (long int)fun.cod_d()";
  local_b8 = "";
  local_b0.m_rows._0_1_ = 0;
  local_b0.m_data = (double *)&PTR__lazy_ostream_00149d00;
  local_a0 = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Coxeter_triangulation/test/function_test.cpp"
  ;
  local_88 = "";
  local_98 = &local_c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_f8.k_);
  if (fun->k_ != 0) {
    uVar1 = 0;
    do {
      if (local_f8.normal_matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows <= (long)uVar1) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>
                (local_f8.normal_matrix_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
                 [uVar1],0.0,1e-10);
      uVar1 = uVar1 + 1;
    } while (uVar1 < fun->k_);
  }
  free(local_f8.normal_matrix_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       m_storage.m_data);
  free(local_f8.off_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      );
  return;
}

Assistant:

void test_function(const Function& fun) {
  Eigen::VectorXd seed = fun.seed();
  Eigen::VectorXd res_seed = fun(fun.seed());
  BOOST_CHECK(seed.size() == (long int)fun.amb_d());
  BOOST_CHECK(res_seed.size() == (long int)fun.cod_d());
  for (std::size_t i = 0; i < fun.cod_d(); i++) GUDHI_TEST_FLOAT_EQUALITY_CHECK(res_seed(i), 0., 1e-10);
}